

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

void __thiscall
lattice::graph::graph
          (graph *this,basis *bs,unitcell *cell,span_t *span,
          vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *boundary)

{
  supercell local_b0;
  
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->coordinates_).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sites_).super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bonds_).super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  supercell::supercell(&local_b0,span);
  init(this,(EVP_PKEY_CTX *)bs);
  if (local_b0.index2lcord_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.index2lcord_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.index2lcord_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.index2lcord_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.lcord2index_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.lcord2index_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.lcord2index_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.lcord2index_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_b0.nmax_.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_b0.nmin_.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_b0.rs_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_b0.span_.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return;
}

Assistant:

graph(const basis& bs, const unitcell& cell, const span_t& span,
        const std::vector<boundary_t>& boundary) {
    init(bs, cell, supercell(span), boundary);
  }